

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  char cVar1;
  ostream *poVar2;
  int iVar3;
  allocator<char> local_195;
  int angle;
  string local_190 [32];
  string imgPath;
  _InputArray local_150;
  Mat img;
  Mat local_d8;
  Mat rotated;
  
  std::operator<<((ostream *)&std::cout,"Enter Image File Path : ");
  imgPath._M_dataplus._M_p = (pointer)&imgPath.field_2;
  imgPath._M_string_length = 0;
  imgPath.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&imgPath);
  iVar3 = -1;
  cv::imread((string *)&img,(int)&imgPath);
  cVar1 = cv::Mat::empty();
  if (cVar1 == '\0') {
    std::operator<<((ostream *)&std::cout,"Enter Angle : ");
    std::istream::operator>>((istream *)&std::cin,&angle);
    angle = angle % 0x168;
    cv::Mat::Mat(&local_d8,&img);
    rotate(&rotated,&local_d8,angle);
    cv::Mat::~Mat(&local_d8);
    cVar1 = cv::Mat::empty();
    if (cVar1 == '\0') {
      std::__cxx11::string::string<std::allocator<char>>(local_190,"Original",&local_195);
      local_150.sz.width = 0;
      local_150.sz.height = 0;
      local_150.flags = 0x1010000;
      local_150.obj = &img;
      cv::imshow(local_190,&local_150);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::string<std::allocator<char>>(local_190,"Rotated",&local_195);
      local_150.sz.width = 0;
      local_150.sz.height = 0;
      local_150.flags = 0x1010000;
      local_150.obj = &rotated;
      cv::imshow(local_190,&local_150);
      std::__cxx11::string::~string(local_190);
      iVar3 = 0;
      cv::waitKey(0);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"ERROR Rotating Image.");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    cv::Mat::~Mat(&rotated);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"ERROR Loading Image File.");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = -1;
  }
  cv::Mat::~Mat(&img);
  std::__cxx11::string::~string((string *)&imgPath);
  return iVar3;
}

Assistant:

int main() {
    cout<<"Enter Image File Path : ";
    string imgPath;
    getline(cin,imgPath);
    Mat img = imread(imgPath,IMREAD_UNCHANGED);
    if(img.empty()){
        cout<<"ERROR Loading Image File."<<endl;
        return -1;
    }
    cout<<"Enter Angle : ";
    int angle;
    cin>>angle;
    angle = angle%360;
    Mat rotated = rotate(img,angle);
    if(rotated.empty()){
        cout<<"ERROR Rotating Image."<<endl;
        return -1;
    }
    imshow("Original", img);
    imshow("Rotated", rotated);
    waitKey(0);
    return 0;
}